

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QItemViewPaintPairs * __thiscall
QAbstractItemViewPrivate::draggablePaintPairs
          (QAbstractItemViewPrivate *this,QModelIndexList *indexes,QRect *r)

{
  bool bVar1;
  QAbstractItemView *pQVar2;
  QModelIndex *pQVar3;
  ulong uVar4;
  QRect *in_RCX;
  QAbstractItemViewPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QModelIndex *index;
  QModelIndexList *__range1;
  QRect *rect;
  QAbstractItemView *q;
  QItemViewPaintPairs *ret;
  QRect clipped;
  QRect current;
  const_iterator __end1;
  const_iterator __begin1;
  QRect viewportRect;
  rvalue_ref in_stack_ffffffffffffff18;
  QRect *pQVar5;
  int pos;
  QRect *in_stack_ffffffffffffff20;
  QWidget *this_00;
  undefined1 local_40 [16];
  QModelIndex *local_30;
  const_iterator local_28;
  const_iterator local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = q_func(in_RSI);
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (undefined1  [16])QWidget::rect(this_00);
  *(undefined1 **)this_00 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this_00->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this_00->super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  QList<QItemViewPaintPair>::QList((QList<QItemViewPaintPair> *)0x8112fb);
  local_20.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = QList<QModelIndex>::begin((QList<QModelIndex> *)in_stack_ffffffffffffff20);
  local_28.i = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QModelIndex>::end((QList<QModelIndex> *)in_stack_ffffffffffffff20);
  while( true ) {
    local_30 = local_28.i;
    bVar1 = QList<QModelIndex>::const_iterator::operator!=(&local_20,local_28);
    if (!bVar1) break;
    pQVar3 = QList<QModelIndex>::const_iterator::operator*(&local_20);
    local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget
                           + 0x1e0))(pQVar2,pQVar3);
    uVar4 = QRect::intersects((QRect *)local_40);
    if ((uVar4 & 1) != 0) {
      QList<QItemViewPaintPair>::append
                ((QList<QItemViewPaintPair> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      QRect::operator|=((QRect *)in_RDI,in_stack_ffffffffffffff20);
    }
    QList<QModelIndex>::const_iterator::operator++(&local_20);
  }
  QRect::operator&(in_RCX,(QRect *)local_18);
  pQVar5 = in_RCX;
  QRect::left((QRect *)0x8114c8);
  pos = (int)((ulong)pQVar5 >> 0x20);
  QRect::setLeft(in_stack_ffffffffffffff20,pos);
  QRect::right((QRect *)0x8114e7);
  QRect::setRight(in_RCX,pos);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QItemViewPaintPairs *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QItemViewPaintPairs QAbstractItemViewPrivate::draggablePaintPairs(const QModelIndexList &indexes, QRect *r) const
{
    Q_ASSERT(r);
    Q_Q(const QAbstractItemView);
    QRect &rect = *r;
    const QRect viewportRect = viewport->rect();
    QItemViewPaintPairs ret;
    for (const auto &index : indexes) {
        const QRect current = q->visualRect(index);
        if (current.intersects(viewportRect)) {
            ret.append({current, index});
            rect |= current;
        }
    }
    QRect clipped = rect & viewportRect;
    rect.setLeft(clipped.left());
    rect.setRight(clipped.right());
    return ret;
}